

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdpvi.cpp
# Opt level: O3

void __thiscall acasx::MDPVI::storeQValues(MDPVI *this)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  pointer piVar5;
  char cVar6;
  ostream *poVar7;
  ulong uVar8;
  long *plVar9;
  MDP *this_00;
  int cStateOrder;
  int *a;
  int *piVar10;
  int k;
  ulong uVar11;
  bool bVar12;
  double dVar13;
  vector<int,_std::allocator<int>_> actions;
  ofstream actionFileWriter;
  ofstream costFileWriter;
  ofstream indexFileWriter;
  vector<int,_std::allocator<int>_> local_648;
  long local_630;
  filebuf local_628 [240];
  ios_base aiStack_538 [264];
  long local_430;
  filebuf local_428 [240];
  ios_base aiStack_338 [264];
  long local_230;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,0x10b611);
  std::ofstream::ofstream(&local_430);
  std::ofstream::open((char *)&local_430,0x10b6c9);
  std::ofstream::ofstream(&local_630);
  std::ofstream::open((char *)&local_630,0x10b6e6);
  cVar6 = std::__basic_file<char>::is_open();
  if (((cVar6 != '\0') && (cVar6 = std::__basic_file<char>::is_open(), cVar6 != '\0')) &&
     (cVar6 = std::__basic_file<char>::is_open(), cVar6 != '\0')) {
    this_00 = this->mdp;
    uVar8 = (ulong)(uint)this_00->numCStates;
    uVar11 = 0;
    if (0 < this_00->numCStates) {
      do {
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_230,(int)uVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_630,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        poVar7 = std::ostream::_M_insert<double>((*this->U)[uVar11]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        uVar11 = uVar11 + 1;
        this_00 = this->mdp;
        uVar8 = (ulong)this_00->numCStates;
      } while ((long)uVar11 < (long)uVar8);
    }
    k = 1;
    do {
      if (0 < (int)uVar8) {
        cStateOrder = 0;
        do {
          MDP::actions(&local_648,this_00,cStateOrder);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_230,(int)uVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          piVar5 = local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          piVar1 = local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar2 = local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (piVar10 = local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = piVar1, piVar10 != piVar5; piVar10 = piVar10 + 1) {
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_630,*piVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            dVar13 = getQValue(this,k,cStateOrder,*piVar10);
            poVar7 = std::ostream::_M_insert<double>(dVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            piVar1 = local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar2 = local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          if (piVar1 != (int *)0x0) {
            operator_delete(piVar1);
          }
          uVar11 = (ulong)(uint)((int)uVar11 + (int)((ulong)((long)piVar2 - (long)piVar1) >> 2));
          cStateOrder = cStateOrder + 1;
          this_00 = this->mdp;
          uVar8 = (ulong)(uint)this_00->numCStates;
        } while (cStateOrder < this_00->numCStates);
      }
      bVar12 = k != 0x15;
      k = k + 1;
    } while (bVar12);
    plVar9 = (long *)std::ostream::operator<<((ostream *)&local_230,(int)uVar11);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    std::ios::widen((char)&local_630 + (char)*(undefined8 *)(local_630 + -0x18));
    std::ostream::put((char)&local_630);
    std::ostream::flush();
    std::ios::widen((char)&local_430 + (char)*(undefined8 *)(local_430 + -0x18));
    std::ostream::put((char)&local_430);
    std::ostream::flush();
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::close();
    uVar4 = __filebuf;
    lVar3 = _VTT;
    local_630 = _VTT;
    *(undefined8 *)(local_628 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_628);
    std::ios_base::~ios_base(aiStack_538);
    local_430 = lVar3;
    *(undefined8 *)(local_428 + *(long *)(lVar3 + -0x18) + -8) = uVar4;
    std::filebuf::~filebuf(local_428);
    std::ios_base::~ios_base(aiStack_338);
    local_230 = lVar3;
    *(undefined8 *)(local_228 + *(long *)(lVar3 + -0x18) + -8) = uVar4;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(aiStack_138);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"failure in opening files",0x18);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  abort();
}

Assistant:

void MDPVI::storeQValues()
{
    ofstream indexFileWriter;
    indexFileWriter.open("indexFile", ios_base::out|ios_base::trunc);
    ofstream costFileWriter;
    costFileWriter.open("costFile", ios_base::out|ios_base::trunc);
    ofstream actionFileWriter;
    actionFileWriter.open("actionFile", ios_base::out|ios_base::trunc);

    if(!indexFileWriter.is_open() || !costFileWriter.is_open() || !actionFileWriter.is_open())
    {
        cerr<<"failure in opening files"<<endl;
        abort();
    }

    int index=0;
    for (int i=0; i<mdp->getCStatesNum(); ++i)//T=k=0
    {
        indexFileWriter<<index<<"\n";
        actionFileWriter<<0<<"\n";  //leaving states, using O to avoid arrayIndexOutofRange problem
        index++;
        costFileWriter<<U[0][i]<<"\n";
    }

    for(int k=1; k<=TIME_HORIZON+1; ++k )
    {
        for (int i=0; i<mdp->getCStatesNum();++i)
        {
            vector<int> actions=mdp->actions(i);
            indexFileWriter<<index<<"\n";
            for (int& a :actions )
            {
                actionFileWriter<<a<<"\n";
                double QValue = getQValue(k, i, a);
                costFileWriter<<QValue<<"\n";
            }
            index+=actions.size();
        }
    }

    indexFileWriter<<index<<endl;
    actionFileWriter<<endl;
    costFileWriter<<endl;

    indexFileWriter.close();
    costFileWriter.close();
    actionFileWriter.close();

}